

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::CFIReaderImpl::Vocabulary::Vocabulary(Vocabulary *this)

{
  allocator local_81 [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  memset(this,0,0x120);
  std::__cxx11::string::string((string *)&local_50,"xml",local_81);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->prefixTable
             ,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"http://www.w3.org/XML/1998/namespace",local_81);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->namespaceNameTable,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Vocabulary() {
            prefixTable.push_back("xml");
            namespaceNameTable.push_back("http://www.w3.org/XML/1998/namespace");
        }